

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O3

void write_var(Context *ctx,Var obj,PropertyId id,Var *var)

{
  Var value;
  
  if (var->type_ == Name) {
    write_string(ctx,obj,id,(var->field_2).name_._M_dataplus._M_p,
                 (var->field_2).name_._M_string_length);
    return;
  }
  if (var->type_ == Index) {
    value = (*ctx->chakra->spec->int64ToVar)((int64)(var->field_2).index_,ctx->chakra->user_data);
    set_property(ctx,obj,id,value,"Unable to write number");
    return;
  }
  __assert_fail("var->is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                ,0x8b,"void write_var(Context *, Js::Var, PropertyId, const Var *)");
}

Assistant:

void write_var(Context* ctx, Js::Var obj, PropertyId id, const Var* var)
{
    if (var->is_index())
    {
        write_int64(ctx, obj, id, var->index());
    }
    else
    {
        assert(var->is_name());
        write_string(ctx, obj, id, var->name());
    }
}